

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double __thiscall ON_PlaneEquation::ZeroTolerance(ON_PlaneEquation *this)

{
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  ON_3dPoint P_03;
  ON_3dPoint P_04;
  ON_3dPoint P_05;
  ON_3dPoint P_06;
  ON_3dPoint P_07;
  ON_3dPoint P_08;
  bool bVar1;
  double dVar2;
  ON_3dVector local_1b8;
  ON_3dPoint local_1a0;
  ON_3dVector local_188;
  ON_3dPoint local_170;
  ON_3dPoint local_158;
  ON_3dPoint local_140;
  undefined1 local_128 [8];
  ON_3dVector Y;
  ON_3dPoint local_f8;
  ON_3dVector local_e0;
  ON_3dPoint local_c8;
  ON_3dPoint local_b0;
  ON_3dPoint local_98;
  double local_80;
  double t;
  ON_3dVector X;
  undefined1 local_48 [8];
  ON_3dPoint P;
  ON_3dVector N;
  double zero_tolerance;
  ON_PlaneEquation *this_local;
  
  N.z = 0.0;
  ON_3dVector::ON_3dVector((ON_3dVector *)&P.z,this->x,this->y,this->z);
  bVar1 = ON_3dVector::Unitize((ON_3dVector *)&P.z);
  if (((bVar1) && (-1.23432101234321e+308 < this->d)) &&
     (this->d <= 1.23432101234321e+308 && this->d != 1.23432101234321e+308)) {
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)local_48,-this->d * P.z,-this->d * N.x,-this->d * N.y);
    X.z = (double)local_48;
    P_00.y = P.x;
    P_00.x = (double)local_48;
    P_00.z = P.y;
    dVar2 = ValueAt(this,P_00);
    N.z = ABS(dVar2);
    ON_3dVector::PerpendicularTo((ON_3dVector *)&t,(ON_3dVector *)&P.z);
    ON_3dVector::Unitize((ON_3dVector *)&t);
    ON_3dPoint::operator+(&local_98,(ON_3dPoint *)local_48,(ON_3dVector *)&t);
    P_01.y = local_98.y;
    P_01.x = local_98.x;
    P_01.z = local_98.z;
    local_80 = ValueAt(this,P_01);
    local_80 = ABS(local_80);
    if (N.z < local_80) {
      N.z = local_80;
    }
    ON_3dPoint::operator-(&local_b0,(ON_3dPoint *)local_48,(ON_3dVector *)&t);
    P_02.y = local_b0.y;
    P_02.x = local_b0.x;
    P_02.z = local_b0.z;
    local_80 = ValueAt(this,P_02);
    local_80 = ABS(local_80);
    if (N.z < local_80) {
      N.z = local_80;
    }
    ::operator*(&local_e0,this->d,(ON_3dVector *)&t);
    ON_3dPoint::operator+(&local_c8,(ON_3dPoint *)local_48,&local_e0);
    P_03.y = local_c8.y;
    P_03.x = local_c8.x;
    P_03.z = local_c8.z;
    local_80 = ValueAt(this,P_03);
    local_80 = ABS(local_80);
    if (N.z < local_80) {
      N.z = local_80;
    }
    ::operator*((ON_3dVector *)&Y.z,this->d,(ON_3dVector *)&t);
    ON_3dPoint::operator-(&local_f8,(ON_3dPoint *)local_48,(ON_3dVector *)&Y.z);
    P_04.y = local_f8.y;
    P_04.x = local_f8.x;
    P_04.z = local_f8.z;
    local_80 = ValueAt(this,P_04);
    local_80 = ABS(local_80);
    if (N.z < local_80) {
      N.z = local_80;
    }
    ON_CrossProduct((ON_3dVector *)local_128,(ON_3dVector *)&P.z,(ON_3dVector *)&t);
    ON_3dVector::Unitize((ON_3dVector *)local_128);
    ON_3dPoint::operator+(&local_140,(ON_3dPoint *)local_48,(ON_3dVector *)local_128);
    P_05.y = local_140.y;
    P_05.x = local_140.x;
    P_05.z = local_140.z;
    local_80 = ValueAt(this,P_05);
    local_80 = ABS(local_80);
    if (N.z < local_80) {
      N.z = local_80;
    }
    ON_3dPoint::operator-(&local_158,(ON_3dPoint *)local_48,(ON_3dVector *)local_128);
    P_06.y = local_158.y;
    P_06.x = local_158.x;
    P_06.z = local_158.z;
    local_80 = ValueAt(this,P_06);
    local_80 = ABS(local_80);
    if (N.z < local_80) {
      N.z = local_80;
    }
    ::operator*(&local_188,this->d,(ON_3dVector *)local_128);
    ON_3dPoint::operator+(&local_170,(ON_3dPoint *)local_48,&local_188);
    P_07.y = local_170.y;
    P_07.x = local_170.x;
    P_07.z = local_170.z;
    local_80 = ValueAt(this,P_07);
    local_80 = ABS(local_80);
    if (N.z < local_80) {
      N.z = local_80;
    }
    ::operator*(&local_1b8,this->d,(ON_3dVector *)local_128);
    ON_3dPoint::operator-(&local_1a0,(ON_3dPoint *)local_48,&local_1b8);
    P_08.y = local_1a0.y;
    P_08.x = local_1a0.x;
    P_08.z = local_1a0.z;
    dVar2 = ValueAt(this,P_08);
    if (N.z < ABS(dVar2)) {
      N.z = ABS(dVar2);
    }
  }
  return N.z;
}

Assistant:

double ON_PlaneEquation::ZeroTolerance() const
{
  double zero_tolerance = 0.0;
  ON_3dVector N(x,y,z);
  if ( N.Unitize() && ON_IS_VALID(d) )
  {
    const ON_3dPoint P( -d*N.x, -d*N.y, -d*N.z  );

    zero_tolerance = fabs(ValueAt(P));

    ON_3dVector X;
    X.PerpendicularTo(N);
    X.Unitize();
    
    double t = fabs(ValueAt(P+X));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-X));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P+d*X));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-d*X));
    if ( t > zero_tolerance )
      zero_tolerance = t;

    ON_3dVector Y = ON_CrossProduct(N,X);
    Y.Unitize();

    t = fabs(ValueAt(P+Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P+d*Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-d*Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
  }

  return zero_tolerance;
}